

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurrentThread.cpp
# Opt level: O0

CurrentThread * __thiscall
sznet::CurrentThread::stackTrace_abi_cxx11_(CurrentThread *this,bool demangle)

{
  void *pvVar1;
  void *local_6d8;
  char *ret;
  char *pcStack_6a8;
  int status;
  char *p;
  char *plus;
  char *left_par;
  void *pvStack_688;
  int i;
  char *demangled;
  size_t len;
  char **strings;
  int local_65c;
  undefined1 local_658 [4];
  int nptrs;
  void *frame [200];
  int max_frames;
  bool demangle_local;
  string *stack;
  
  frame[199]._6_1_ = 0;
  frame[199]._7_1_ = demangle;
  std::__cxx11::string::string((string *)this);
  frame[199]._0_4_ = 200;
  local_65c = backtrace(local_658,200);
  len = backtrace_symbols(local_658,local_65c);
  if (len != 0) {
    demangled = (char *)0x100;
    if ((frame[199]._7_1_ & 1) == 0) {
      local_6d8 = (void *)0x0;
    }
    else {
      local_6d8 = malloc(0x100);
    }
    pvStack_688 = local_6d8;
    for (left_par._4_4_ = 1; left_par._4_4_ < local_65c; left_par._4_4_ = left_par._4_4_ + 1) {
      if ((frame[199]._7_1_ & 1) == 0) {
LAB_00135b97:
        std::__cxx11::string::append((char *)this);
        std::__cxx11::string::push_back((char)this);
      }
      else {
        plus = (char *)0x0;
        p = (char *)0x0;
        for (pcStack_6a8 = *(char **)(len + (long)left_par._4_4_ * 8); *pcStack_6a8 != '\0';
            pcStack_6a8 = pcStack_6a8 + 1) {
          if (*pcStack_6a8 == '(') {
            plus = pcStack_6a8;
          }
          else if (*pcStack_6a8 == '+') {
            p = pcStack_6a8;
          }
        }
        if ((plus == (char *)0x0) || (p == (char *)0x0)) goto LAB_00135b97;
        *p = '\0';
        ret._4_4_ = 0;
        pvVar1 = (void *)__cxa_demangle(plus + 1,pvStack_688,&demangled,(long)&ret + 4);
        *p = '+';
        if (ret._4_4_ != 0) goto LAB_00135b97;
        pvStack_688 = pvVar1;
        std::__cxx11::string::append<char*,void>
                  ((string *)this,*(char **)(len + (long)left_par._4_4_ * 8),plus + 1);
        std::__cxx11::string::append((char *)this);
        std::__cxx11::string::append((char *)this);
        std::__cxx11::string::push_back((char)this);
      }
    }
    free(pvStack_688);
    free((void *)len);
  }
  return this;
}

Assistant:

string stackTrace(bool demangle)
{
	string stack;
	const int max_frames = 200;
	void* frame[max_frames];
	// 该函数用于获取当前线程的调用堆栈,获取的信息将会被存放在buffer中,它是一个指针列表
	int nptrs = ::backtrace(frame, max_frames);
	// backtrace_symbols将从backtrace函数获取的信息转化为一个字符串数组
	char** strings = ::backtrace_symbols(frame, nptrs);
	if (strings)
	{
		size_t len = 256;
		char* demangled = demangle ? static_cast<char*>(::malloc(len)) : nullptr;
		for (int i = 1; i < nptrs; ++i)  // skipping the 0-th, which is this function
		{
			if (demangle)
			{
				// https://panthema.net/2008/0901-stacktrace-demangled/
				// bin/exception_test(_ZN3Bar4testEv+0x79) [0x401909]
				char* left_par = nullptr;
				char* plus = nullptr;
				for (char* p = strings[i]; *p; ++p)
				{
					if (*p == '(')
						left_par = p;
					else if (*p == '+')
						plus = p;
				}

				if (left_par && plus)
				{
					*plus = '\0';
					int status = 0;
					char* ret = abi::__cxa_demangle(left_par + 1, demangled, &len, &status);
					*plus = '+';
					if (status == 0)
					{
						demangled = ret;  // ret could be realloc()
						stack.append(strings[i], left_par + 1);
						stack.append(demangled);
						stack.append(plus);
						stack.push_back('\n');
						continue;
					}
				}
			}
			// Fallback to mangled names
			stack.append(strings[i]);
			stack.push_back('\n');
		}
		free(demangled);
		free(strings);
	}
	return stack;
}